

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrayref.h
# Opt level: O0

void __thiscall
mp::ArrayRef<char_const*>::init_from_rvalue<mp::ArrayRef<char_const*>>
          (ArrayRef<const_char_*> *this,ArrayRef<const_char_*> *other)

{
  size_type sVar1;
  char **ppcVar2;
  pointer ppcVar3;
  ArrayRef<const_char_*> *in_RSI;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_RDI;
  vector<const_char_*,_std::allocator<const_char_*>_> *unaff_retaddr;
  vector<const_char_*,_std::allocator<const_char_*>_> *__x;
  
  __x = in_RDI;
  sVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size(&in_RSI->save_);
  if (sVar1 == 0) {
    ppcVar2 = ArrayRef<const_char_*>::data(in_RSI);
    in_RDI[1].super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_start = ppcVar2;
    ppcVar3 = (pointer)ArrayRef<const_char_*>::size(in_RSI);
    in_RDI[1].super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppcVar3;
  }
  else {
    std::vector<const_char_*,_std::allocator<const_char_*>_>::operator=(unaff_retaddr,__x);
    ppcVar2 = std::vector<const_char_*,_std::allocator<const_char_*>_>::data
                        ((vector<const_char_*,_std::allocator<const_char_*>_> *)0x44ba6e);
    in_RDI[1].super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_start = ppcVar2;
    ppcVar3 = (pointer)std::vector<const_char_*,_std::allocator<const_char_*>_>::size(in_RDI);
    in_RDI[1].super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppcVar3;
  }
  return;
}

Assistant:

void init_from_rvalue(AR&& other) noexcept {
      if (other.save_.size()) {
        save_ = std::move(other.save_);
        data_ = save_.data();
        size_ = save_.size();
      }
      else {
        data_ = other.data();
        size_ = other.size();
      }
    }